

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O3

void Io_WriteVerilogInt(FILE *pFile,Abc_Ntk_t *pNtk,int fOnlyAnds)

{
  long *plVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  Mio_Gate_t *pGate;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  Mio_Pin_t *pPin;
  Vec_Vec_t *vLevels;
  void **ppvVar12;
  Hop_Obj_t *pHVar13;
  Hop_Obj_t *pHVar14;
  ulong uVar15;
  Vec_Ptr_t *pVVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  int local_74;
  
  pcVar9 = Io_WriteVerilogGetName(pNtk->pName);
  fprintf((FILE *)pFile,"module %s ( ",pcVar9);
  if ((0 < pNtk->nObjCounts[8]) &&
     (iVar6 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar6 == -1)) {
    fwrite("clock, ",7,1,(FILE *)pFile);
  }
  fwrite("\n   ",4,1,(FILE *)pFile);
  if (0 < pNtk->vPis->nSize) {
    Io_WriteVerilogPis(pFile,pNtk,3);
    fwrite(",\n   ",5,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPos->nSize) {
    Io_WriteVerilogPos(pFile,pNtk,3);
  }
  fwrite("  );\n",5,1,(FILE *)pFile);
  if ((0 < pNtk->nObjCounts[8]) &&
     (iVar6 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar6 == -1)) {
    fwrite("  input  clock;\n",0x10,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPis->nSize) {
    fwrite("  input ",8,1,(FILE *)pFile);
    Io_WriteVerilogPis(pFile,pNtk,10);
    fwrite(";\n",2,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPos->nSize) {
    fwrite("  output",8,1,(FILE *)pFile);
    Io_WriteVerilogPos(pFile,pNtk,5);
    fwrite(";\n",2,1,(FILE *)pFile);
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLACKBOX) {
    if (0 < pNtk->nObjCounts[8]) {
      fwrite("  reg",5,1,(FILE *)pFile);
      pVVar16 = pNtk->vBoxes;
      if (0 < pVVar16->nSize) {
        iVar6 = pNtk->nObjCounts[8];
        iVar23 = 4;
        lVar25 = 0;
        iVar26 = 0;
        iVar19 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar25];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pAVar2 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
            pcVar9 = Abc_ObjName(pAVar2);
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            sVar10 = strlen(pcVar9);
            iVar24 = (int)sVar10 + 2;
            if (iVar19 == 0) {
LAB_0034a453:
              iVar19 = 0;
            }
            else if (0x4b < iVar23 + iVar24) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar23 = 3;
              goto LAB_0034a453;
            }
            iVar26 = iVar26 + 1;
            pcVar9 = Abc_ObjName(pAVar2);
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            pcVar18 = ",";
            if (iVar26 == iVar6) {
              pcVar18 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar9,pcVar18);
            iVar23 = iVar23 + iVar24;
            iVar19 = iVar19 + 1;
            pVVar16 = pNtk->vBoxes;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < pVVar16->nSize);
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    iVar6 = Io_WriteVerilogWiresCount(pNtk);
    if (0 < iVar6) {
      fwrite("  wire",6,1,(FILE *)pFile);
      iVar6 = Io_WriteVerilogWiresCount(pNtk);
      pVVar16 = pNtk->vObjs;
      if (pVVar16->nSize < 1) {
        iVar19 = 0;
        iVar23 = 4;
        local_74 = 0;
      }
      else {
        iVar23 = 4;
        lVar25 = 0;
        local_74 = 0;
        iVar19 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar25];
          if ((((plVar1 != (long *)0x0) && (lVar25 != 0)) &&
              ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
             ((pAVar2 = *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8),
              (pAVar2->vFanouts).nSize < 1 ||
              ((*(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x14) &
               0xf) - 5 < 0xfffffffe)))) {
            pcVar9 = Abc_ObjName(pAVar2);
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            sVar10 = strlen(pcVar9);
            iVar26 = (int)sVar10 + 2;
            if (iVar19 == 0) {
LAB_0034a5f3:
              iVar19 = 0;
            }
            else if (0x4b < iVar26 + iVar23) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar23 = 3;
              goto LAB_0034a5f3;
            }
            local_74 = local_74 + 1;
            pcVar9 = Abc_ObjName(pAVar2);
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            pcVar18 = ",";
            if (local_74 == iVar6) {
              pcVar18 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar9,pcVar18);
            iVar23 = iVar23 + iVar26;
            iVar19 = iVar19 + 1;
            pVVar16 = pNtk->vObjs;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < pVVar16->nSize);
      }
      pVVar16 = pNtk->vBoxes;
      if (0 < pVVar16->nSize) {
        lVar25 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar25];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pAVar2 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
            pcVar9 = Abc_ObjName(pAVar2);
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            sVar10 = strlen(pcVar9);
            iVar26 = (int)sVar10 + 2;
            if (iVar19 == 0) {
LAB_0034a724:
              iVar19 = 0;
            }
            else if (0x4b < iVar23 + iVar26) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar23 = 3;
              goto LAB_0034a724;
            }
            local_74 = local_74 + 1;
            pcVar9 = Abc_ObjName(pAVar2);
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            pcVar18 = ",";
            if (local_74 == iVar6) {
              pcVar18 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar9,pcVar18);
            iVar23 = iVar23 + iVar26;
            iVar19 = iVar19 + 1;
            pVVar16 = pNtk->vBoxes;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < pVVar16->nSize);
        if (0 < pVVar16->nSize) {
          lVar25 = 0;
          do {
            plVar1 = (long *)pVVar16->pArray[lVar25];
            if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
              if (0 < *(int *)((long)plVar1 + 0x1c)) {
                lVar20 = 0;
                do {
                  plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                     (long)*(int *)(plVar1[4] + lVar20 * 4) * 8);
                  pAVar2 = *(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8)
                  ;
                  pcVar9 = Abc_ObjName(pAVar2);
                  pcVar9 = Io_WriteVerilogGetName(pcVar9);
                  sVar10 = strlen(pcVar9);
                  iVar26 = (int)sVar10 + 2;
                  if (iVar19 == 0) {
LAB_0034a865:
                    iVar19 = 0;
                  }
                  else if (0x4b < iVar23 + iVar26) {
                    fwrite("\n   ",4,1,(FILE *)pFile);
                    iVar23 = 3;
                    goto LAB_0034a865;
                  }
                  pcVar9 = Abc_ObjName(pAVar2);
                  pcVar9 = Io_WriteVerilogGetName(pcVar9);
                  pcVar18 = ",";
                  if (local_74 + (1 - iVar6) + (int)lVar20 == 0) {
                    pcVar18 = "";
                  }
                  fprintf((FILE *)pFile," %s%s",pcVar9,pcVar18);
                  iVar23 = iVar23 + iVar26;
                  iVar19 = iVar19 + 1;
                  lVar20 = lVar20 + 1;
                } while (lVar20 < *(int *)((long)plVar1 + 0x1c));
                local_74 = local_74 + (int)lVar20;
              }
              iVar26 = *(int *)((long)plVar1 + 0x2c);
              if (0 < iVar26) {
                lVar20 = 0;
                do {
                  plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                     (long)*(int *)(plVar1[6] + lVar20 * 4) * 8);
                  pAVar2 = *(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8)
                  ;
                  if (((pAVar2->vFanouts).nSize < 1) ||
                     ((*(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] +
                                0x14) & 0xf) - 5 < 0xfffffffe)) {
                    pcVar9 = Abc_ObjName(pAVar2);
                    pcVar9 = Io_WriteVerilogGetName(pcVar9);
                    sVar10 = strlen(pcVar9);
                    iVar26 = (int)sVar10 + 2;
                    if (iVar19 == 0) {
LAB_0034a983:
                      iVar19 = 0;
                    }
                    else if (0x4b < iVar23 + iVar26) {
                      fwrite("\n   ",4,1,(FILE *)pFile);
                      iVar23 = 3;
                      goto LAB_0034a983;
                    }
                    local_74 = local_74 + 1;
                    pcVar9 = Abc_ObjName(pAVar2);
                    pcVar9 = Io_WriteVerilogGetName(pcVar9);
                    pcVar18 = ",";
                    if (local_74 == iVar6) {
                      pcVar18 = "";
                    }
                    fprintf((FILE *)pFile," %s%s",pcVar9,pcVar18);
                    iVar23 = iVar23 + iVar26;
                    iVar19 = iVar19 + 1;
                    iVar26 = *(int *)((long)plVar1 + 0x2c);
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 < iVar26);
              }
            }
            lVar25 = lVar25 + 1;
            pVVar16 = pNtk->vBoxes;
          } while (lVar25 < pVVar16->nSize);
        }
      }
      if (local_74 != iVar6) {
        __assert_fail("Counter == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteVerilog.c"
                      ,0x17e,"void Io_WriteVerilogWires(FILE *, Abc_Ntk_t *, int)");
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    pVVar16 = pNtk->vBoxes;
    uVar17 = pVVar16->nSize - pNtk->nObjCounts[8];
    uVar15 = (ulong)uVar17;
    if (1 < uVar17) {
      uVar15 = 0;
      uVar17 = uVar17 - 1;
      do {
        uVar15 = (ulong)((int)uVar15 + 1);
        bVar5 = 9 < uVar17;
        uVar17 = uVar17 / 10;
      } while (bVar5);
    }
    if (0 < pVVar16->nSize) {
      lVar25 = 0;
      iVar6 = 0;
      do {
        plVar1 = (long *)pVVar16->pArray[lVar25];
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
          lVar20 = plVar1[7];
          fprintf((FILE *)pFile,"  %s box%0*d",*(undefined8 *)(lVar20 + 8),uVar15,iVar6);
          fputc(0x28,(FILE *)pFile);
          lVar11 = *(long *)(lVar20 + 0x28);
          if (0 < *(int *)(lVar11 + 4)) {
            lVar21 = 0;
            do {
              plVar3 = *(long **)(*(long *)(lVar11 + 8) + lVar21 * 8);
              pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[6] * 8));
              pcVar9 = Io_WriteVerilogGetName(pcVar9);
              fprintf((FILE *)pFile,".%s",pcVar9);
              plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)(plVar1[4] + lVar21 * 4) * 8);
              pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8));
              pcVar9 = Io_WriteVerilogGetName(pcVar9);
              fprintf((FILE *)pFile,"(%s), ",pcVar9);
              lVar21 = lVar21 + 1;
              lVar11 = *(long *)(lVar20 + 0x28);
            } while (lVar21 < *(int *)(lVar11 + 4));
          }
          lVar11 = *(long *)(lVar20 + 0x30);
          if (0 < *(int *)(lVar11 + 4)) {
            uVar22 = 0;
            do {
              plVar3 = *(long **)(*(long *)(lVar11 + 8) + uVar22 * 8);
              pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8));
              pcVar9 = Io_WriteVerilogGetName(pcVar9);
              fprintf((FILE *)pFile,".%s",pcVar9);
              plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)(plVar1[6] + uVar22 * 4) * 8);
              pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[6] * 8));
              pcVar18 = Io_WriteVerilogGetName(pcVar9);
              pcVar9 = "    \"%s\", ";
              if (uVar22 == *(int *)(*(long *)(lVar20 + 0x30) + 4) - 1) {
                pcVar9 = "T = %d\t\t";
              }
              fprintf((FILE *)pFile,"(%s)%s",pcVar18,pcVar9 + 8);
              uVar22 = uVar22 + 1;
              lVar11 = *(long *)(lVar20 + 0x30);
            } while ((long)uVar22 < (long)*(int *)(lVar11 + 4));
          }
          iVar6 = iVar6 + 1;
          fwrite(");\n",3,1,(FILE *)pFile);
          pVVar16 = pNtk->vBoxes;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < pVVar16->nSize);
    }
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      uVar7 = Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc);
      uVar17 = pNtk->nObjCounts[7];
      if (1 < uVar17) {
        uVar8 = uVar17 - 1;
        uVar17 = 0;
        do {
          uVar17 = uVar17 + 1;
          bVar5 = 9 < uVar8;
          uVar8 = uVar8 / 10;
        } while (bVar5);
      }
      pVVar16 = pNtk->vObjs;
      if (0 < pVVar16->nSize) {
        lVar25 = 0;
        uVar15 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar25];
          if ((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) {
            pGate = (Mio_Gate_t *)plVar1[7];
            if (*(int *)((long)plVar1 + 0x1c) == 0) {
              pcVar9 = Mio_GateReadName(pGate);
              iVar6 = strcmp(pcVar9,"_const0_");
              if (iVar6 != 0) {
                pcVar9 = Mio_GateReadName(pGate);
                iVar6 = strcmp(pcVar9,"_const1_");
                if (iVar6 != 0) goto LAB_0034ad3f;
              }
              pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[6] * 8));
              pcVar9 = Io_WriteVerilogGetName(pcVar9);
              pcVar18 = Mio_GateReadName(pGate);
              iVar6 = strcmp(pcVar18,"_const1_");
              fprintf((FILE *)pFile,"  %-*s %s = 1\'b%d;\n",(ulong)uVar7,"assign",pcVar9,
                      (ulong)(iVar6 == 0));
            }
            else {
LAB_0034ad3f:
              pcVar9 = Mio_GateReadName(pGate);
              lVar20 = 0;
              fprintf((FILE *)pFile,"  %-*s g%0*d",(ulong)uVar7,pcVar9,(ulong)uVar17,uVar15);
              fputc(0x28,(FILE *)pFile);
              pPin = Mio_GateReadPins(pGate);
              if (pPin != (Mio_Pin_t *)0x0) {
                lVar20 = 0;
                do {
                  pcVar9 = Mio_PinReadName(pPin);
                  pcVar9 = Io_WriteVerilogGetName(pcVar9);
                  fprintf((FILE *)pFile,".%s",pcVar9);
                  pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                        (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                        (long)*(int *)(plVar1[4] + lVar20 * 4) * 8));
                  pcVar9 = Io_WriteVerilogGetName(pcVar9);
                  fprintf((FILE *)pFile,"(%s), ",pcVar9);
                  pPin = Mio_PinReadNext(pPin);
                  lVar20 = lVar20 + 1;
                } while (pPin != (Mio_Pin_t *)0x0);
              }
              if ((int)lVar20 != *(int *)((long)plVar1 + 0x1c)) {
                __assert_fail("i == Abc_ObjFaninNum(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteVerilog.c"
                              ,0x227,"void Io_WriteVerilogObjects(FILE *, Abc_Ntk_t *, int)");
              }
              uVar15 = (ulong)((int)uVar15 + 1);
              pcVar9 = Mio_GateReadOutName(pGate);
              pcVar9 = Io_WriteVerilogGetName(pcVar9);
              fprintf((FILE *)pFile,".%s",pcVar9);
              pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[6] * 8));
              pcVar9 = Io_WriteVerilogGetName(pcVar9);
              fprintf((FILE *)pFile,"(%s)",pcVar9);
              fwrite(");\n",3,1,(FILE *)pFile);
            }
          }
          lVar25 = lVar25 + 1;
          pVVar16 = pNtk->vObjs;
        } while (lVar25 < pVVar16->nSize);
      }
    }
    else {
      vLevels = (Vec_Vec_t *)malloc(0x10);
      vLevels->nCap = 10;
      vLevels->nSize = 0;
      ppvVar12 = (void **)malloc(0x50);
      vLevels->pArray = ppvVar12;
      pVVar16 = pNtk->vObjs;
      if (0 < pVVar16->nSize) {
        lVar25 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar25];
          if ((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) {
            pHVar14 = (Hop_Obj_t *)plVar1[7];
            pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[6] * 8));
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            fprintf((FILE *)pFile,"  assign %s = ",pcVar9);
            if (0 < *(int *)((long)plVar1 + 0x1c)) {
              lVar20 = 0;
              do {
                pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                      (long)*(int *)(plVar1[4] + lVar20 * 4) * 8));
                pcVar9 = Io_WriteVerilogGetName(pcVar9);
                pcVar9 = Extra_UtilStrsav(pcVar9);
                pHVar13 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,(int)lVar20);
                (pHVar13->field_0).pData = pcVar9;
                lVar20 = lVar20 + 1;
              } while (lVar20 < *(int *)((long)plVar1 + 0x1c));
            }
            Hop_ObjPrintVerilog(pFile,pHVar14,vLevels,0,fOnlyAnds);
            fwrite(";\n",2,1,(FILE *)pFile);
            if (0 < *(int *)((long)plVar1 + 0x1c)) {
              iVar6 = 0;
              do {
                pHVar14 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar6);
                if ((pHVar14->field_0).pData != (void *)0x0) {
                  pHVar14 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar6);
                  free((pHVar14->field_0).pData);
                  pHVar14 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar6);
                  (pHVar14->field_0).pData = (void *)0x0;
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 < *(int *)((long)plVar1 + 0x1c));
            }
          }
          lVar25 = lVar25 + 1;
          pVVar16 = pNtk->vObjs;
        } while (lVar25 < pVVar16->nSize);
        iVar6 = vLevels->nSize;
        if (0 < iVar6) {
          lVar25 = 0;
          do {
            pvVar4 = vLevels->pArray[lVar25];
            if (pvVar4 != (void *)0x0) {
              if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar4 + 8));
              }
              free(pvVar4);
              iVar6 = vLevels->nSize;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < iVar6);
        }
      }
      if (vLevels->pArray != (void **)0x0) {
        free(vLevels->pArray);
      }
      free(vLevels);
    }
    if (0 < pNtk->nObjCounts[8]) {
      fwrite("  always @ (posedge clock) begin\n",0x21,1,(FILE *)pFile);
      pVVar16 = pNtk->vBoxes;
      if (0 < pVVar16->nSize) {
        lVar25 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar25];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)plVar3[6] * 8));
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            fprintf((FILE *)pFile,"    %s",pcVar9);
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            pcVar9 = Io_WriteVerilogGetName(pcVar9);
            fprintf((FILE *)pFile," <= %s;\n",pcVar9);
            pVVar16 = pNtk->vBoxes;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < pVVar16->nSize);
      }
      fwrite("  end\n",6,1,(FILE *)pFile);
      uVar17 = pNtk->vBoxes->nSize;
      if ((int)uVar17 < 1) {
        uVar15 = 0;
      }
      else {
        uVar22 = 0;
        do {
          pvVar4 = pNtk->vBoxes->pArray[uVar22];
          if (((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 8) &&
             (uVar15 = uVar22, *(int *)((long)pvVar4 + 0x38) - 1U < 2)) break;
          uVar22 = uVar22 + 1;
          uVar15 = (ulong)uVar17;
        } while (uVar17 != uVar22);
      }
      if ((int)uVar15 != pNtk->nObjCounts[8]) {
        fwrite("  initial begin\n",0x10,1,(FILE *)pFile);
        pVVar16 = pNtk->vBoxes;
        if (0 < pVVar16->nSize) {
          lVar25 = 0;
          do {
            plVar1 = (long *)pVVar16->pArray[lVar25];
            if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
              pcVar9 = "    %s <= 1\'b0;\n";
              if ((int)plVar1[7] != 1) {
                if ((int)plVar1[7] != 2) goto LAB_0034b38f;
                pcVar9 = "    %s <= 1\'b1;\n";
              }
              plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)plVar1[6] * 8);
              pcVar18 = Abc_ObjName(*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                     (long)*(int *)plVar1[6] * 8));
              pcVar18 = Io_WriteVerilogGetName(pcVar18);
              fprintf((FILE *)pFile,pcVar9,pcVar18);
              pVVar16 = pNtk->vBoxes;
            }
LAB_0034b38f:
            lVar25 = lVar25 + 1;
          } while (lVar25 < pVVar16->nSize);
        }
        fwrite("  end\n",6,1,(FILE *)pFile);
      }
    }
  }
  fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteVerilogInt( FILE * pFile, Abc_Ntk_t * pNtk, int fOnlyAnds )
{
    // write inputs and outputs
//    fprintf( pFile, "module %s ( gclk,\n   ", Abc_NtkName(pNtk) );
    fprintf( pFile, "module %s ( ", Io_WriteVerilogGetName(Abc_NtkName(pNtk)) );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "clock, " );
    // write other primary inputs
    fprintf( pFile, "\n   " );
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
        Io_WriteVerilogPis( pFile, pNtk, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
        Io_WriteVerilogPos( pFile, pNtk, 3 );
    fprintf( pFile, "  );\n" );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "  input  clock;\n" );
    // write inputs, outputs, registers, and wires
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
//        fprintf( pFile, "  input gclk," );
        fprintf( pFile, "  input " );
        Io_WriteVerilogPis( pFile, pNtk, 10 );
        fprintf( pFile, ";\n" );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
    {
        fprintf( pFile, "  output" );
        Io_WriteVerilogPos( pFile, pNtk, 5 );
        fprintf( pFile, ";\n" );
    }
    // if this is not a blackbox, write internal signals
    if ( !Abc_NtkHasBlackbox(pNtk) )
    {
        if ( Abc_NtkLatchNum(pNtk) > 0 )
        {
            fprintf( pFile, "  reg" );
            Io_WriteVerilogRegs( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        if ( Io_WriteVerilogWiresCount(pNtk) > 0 )
        {
            fprintf( pFile, "  wire" );
            Io_WriteVerilogWires( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        // write nodes
        Io_WriteVerilogObjects( pFile, pNtk, fOnlyAnds );        
        // write registers
        if ( Abc_NtkLatchNum(pNtk) > 0 )
            Io_WriteVerilogLatches( pFile, pNtk );
    }
    // finalize the file
    fprintf( pFile, "endmodule\n\n" );
}